

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall Generator::generateSignal(Generator *this,FunctionDef *def,int index)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  ArgumentDef *this_00;
  qsizetype qVar5;
  uint in_EDX;
  QByteArray *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  ArgumentDef *a;
  int offset;
  char *constQualifier;
  QByteArray returnType;
  const_iterator it;
  const_iterator end;
  const_iterator begin;
  QByteArray thisPtr;
  QStringBuilder<QStringBuilder<const_char_(&)[13],_QByteArray_&>,_const_char_(&)[10]>
  *in_stack_fffffffffffffea8;
  FILE *pFVar6;
  QStringBuilder<const_char_(&)[13],_QByteArray_&> *in_stack_fffffffffffffeb0;
  FILE *in_stack_fffffffffffffeb8;
  uint7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  undefined1 uVar7;
  QByteArray *in_stack_fffffffffffffec8;
  QByteArray *in_stack_fffffffffffffed0;
  byte local_121;
  uint local_f4;
  int local_e8;
  char *local_e0;
  const_iterator local_80;
  const_iterator local_78;
  const_iterator local_70;
  char *local_68;
  QStringBuilder<const_char_(&)[13],_QByteArray_&> local_60;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((ulong)in_RSI[8].d.d & 0x100000000) == 0) &&
     (((ulong)in_RSI[8].d.ptr & 0x1000000000000) == 0)) {
    pFVar6 = *(FILE **)(in_RDI + 8);
    pcVar2 = QByteArray::constData((QByteArray *)0x11124d);
    pcVar3 = QByteArray::constData((QByteArray *)0x111267);
    pcVar4 = QByteArray::constData((QByteArray *)0x111280);
    fprintf(pFVar6,"\n// SIGNAL %d\n%s %s::%s(",(ulong)in_EDX,pcVar2,pcVar3,pcVar4);
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray
              ((QByteArray *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
               (char *)in_stack_fffffffffffffeb8,(qsizetype)in_stack_fffffffffffffeb0);
    local_e0 = "";
    if (((ulong)in_RSI[8].d.d & 1) != 0) {
      local_60 = ::operator+((char (*) [13])in_stack_fffffffffffffeb0,
                             (QByteArray *)in_stack_fffffffffffffea8);
      ::operator+(in_stack_fffffffffffffeb0,(char (*) [10])in_stack_fffffffffffffea8);
      ::QStringBuilder::operator_cast_to_QByteArray(in_stack_fffffffffffffea8);
      QByteArray::operator=
                ((QByteArray *)in_stack_fffffffffffffeb0,(QByteArray *)in_stack_fffffffffffffea8);
      QByteArray::~QByteArray((QByteArray *)0x111389);
      local_e0 = "const";
    }
    bVar1 = QList<ArgumentDef>::isEmpty((QList<ArgumentDef> *)0x1113a6);
    local_121 = 0;
    if (bVar1) {
      local_68 = "void";
      bVar1 = ::operator==((QByteArray *)
                           CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                           (char **)in_stack_fffffffffffffeb8);
      local_121 = 0;
      if (bVar1) {
        local_121 = *(byte *)((long)&in_RSI[8].d.ptr + 3) ^ 0xff;
      }
    }
    if ((local_121 & 1) == 0) {
      local_e8 = 1;
      local_70.i = (ArgumentDef *)&DAT_aaaaaaaaaaaaaaaa;
      local_70 = QList<ArgumentDef>::cbegin((QList<ArgumentDef> *)in_stack_fffffffffffffeb0);
      local_78.i = (ArgumentDef *)&DAT_aaaaaaaaaaaaaaaa;
      local_78 = QList<ArgumentDef>::cend((QList<ArgumentDef> *)in_stack_fffffffffffffeb0);
      local_80.i = local_70.i;
      while (bVar1 = QList<ArgumentDef>::const_iterator::operator!=(&local_80,local_78), bVar1) {
        this_00 = QList<ArgumentDef>::const_iterator::operator*(&local_80);
        bVar1 = QList<ArgumentDef>::const_iterator::operator!=(&local_80,local_70);
        if (bVar1) {
          fputs(", ",*(FILE **)(in_RDI + 8));
        }
        qVar5 = QByteArray::size((QByteArray *)this_00);
        if (qVar5 != 0) {
          pcVar2 = QByteArray::constData((QByteArray *)0x11157f);
          fputs(pcVar2,*(FILE **)(in_RDI + 8));
        }
        local_e8 = local_e8 + 1;
        fprintf(*(FILE **)(in_RDI + 8)," _t%d");
        qVar5 = QByteArray::size(&this_00->rightType);
        if (qVar5 != 0) {
          pcVar2 = QByteArray::constData((QByteArray *)0x1115d6);
          fputs(pcVar2,*(FILE **)(in_RDI + 8));
        }
        QList<ArgumentDef>::const_iterator::operator++(&local_80);
      }
      if (((ulong)in_RSI[8].d.ptr & 0x1000000) != 0) {
        bVar1 = QList<ArgumentDef>::isEmpty((QList<ArgumentDef> *)0x11161d);
        if (!bVar1) {
          fprintf(*(FILE **)(in_RDI + 8),", ");
        }
        local_e8 = local_e8 + 1;
        fprintf(*(FILE **)(in_RDI + 8),"QPrivateSignal _t%d");
      }
      fprintf(*(FILE **)(in_RDI + 8),")%s\n{\n",local_e0);
      qVar5 = QByteArray::size(in_RSI);
      uVar7 = false;
      if (qVar5 != 0) {
        uVar7 = ::operator!=(in_stack_fffffffffffffec8,(char **)(ulong)in_stack_fffffffffffffec0);
      }
      if ((bool)uVar7 != false) {
        noRef(in_stack_fffffffffffffed0);
        in_stack_fffffffffffffeb8 = *(FILE **)(in_RDI + 8);
        pcVar2 = QByteArray::constData((QByteArray *)0x11172e);
        fprintf(in_stack_fffffffffffffeb8,"    %s _t0{};\n",pcVar2);
        QByteArray::~QByteArray((QByteArray *)0x111751);
      }
      pFVar6 = *(FILE **)(in_RDI + 8);
      pcVar2 = QByteArray::constData((QByteArray *)0x11176f);
      pcVar3 = QByteArray::constData((QByteArray *)0x111781);
      fprintf(pFVar6,"    QMetaObject::activate<%s>(%s, &staticMetaObject, %d, ",pcVar2,pcVar3,
              (ulong)in_EDX);
      bVar1 = ::operator==((QByteArray *)CONCAT17(uVar7,in_stack_fffffffffffffec0),
                           (char **)in_stack_fffffffffffffeb8);
      if (bVar1) {
        fprintf(*(FILE **)(in_RDI + 8),"nullptr");
      }
      else {
        fprintf(*(FILE **)(in_RDI + 8),"std::addressof(_t0)");
      }
      for (local_f4 = 1; (int)local_f4 < local_e8; local_f4 = local_f4 + 1) {
        fprintf(*(FILE **)(in_RDI + 8),", _t%d",(ulong)local_f4);
      }
      fprintf(*(FILE **)(in_RDI + 8),");\n");
      bVar1 = ::operator!=(in_stack_fffffffffffffec8,
                           (char **)CONCAT17(uVar7,in_stack_fffffffffffffec0));
      if (bVar1) {
        fprintf(*(FILE **)(in_RDI + 8),"    return _t0;\n");
      }
      fprintf(*(FILE **)(in_RDI + 8),"}\n");
    }
    else {
      pFVar6 = *(FILE **)(in_RDI + 8);
      pcVar2 = QByteArray::constData((QByteArray *)0x11142f);
      fprintf(pFVar6,")%s\n{\n    QMetaObject::activate(%s, &staticMetaObject, %d, nullptr);\n}\n",
              local_e0,pcVar2,(ulong)in_EDX);
    }
    QByteArray::~QByteArray((QByteArray *)0x1118cb);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Generator::generateSignal(const FunctionDef *def, int index)
{
    if (def->wasCloned || def->isAbstract)
        return;
    fprintf(out, "\n// SIGNAL %d\n%s %s::%s(",
            index, def->type.name.constData(), cdef->qualified.constData(), def->name.constData());

    QByteArray thisPtr = "this";
    const char *constQualifier = "";

    if (def->isConst) {
        thisPtr = "const_cast< " + cdef->qualified + " *>(this)";
        constQualifier = "const";
    }

    Q_ASSERT(!def->normalizedType.isEmpty());
    if (def->arguments.isEmpty() && def->normalizedType == "void" && !def->isPrivateSignal) {
        fprintf(out, ")%s\n{\n"
                "    QMetaObject::activate(%s, &staticMetaObject, %d, nullptr);\n"
                "}\n", constQualifier, thisPtr.constData(), index);
        return;
    }

    int offset = 1;
    const auto begin = def->arguments.cbegin();
    const auto end = def->arguments.cend();
    for (auto it = begin; it != end; ++it) {
        const ArgumentDef &a = *it;
        if (it != begin)
            fputs(", ", out);
        if (a.type.name.size())
            fputs(a.type.name.constData(), out);
        fprintf(out, " _t%d", offset++);
        if (a.rightType.size())
            fputs(a.rightType.constData(), out);
    }
    if (def->isPrivateSignal) {
        if (!def->arguments.isEmpty())
            fprintf(out, ", ");
        fprintf(out, "QPrivateSignal _t%d", offset++);
    }

    fprintf(out, ")%s\n{\n", constQualifier);
    if (def->type.name.size() && def->normalizedType != "void") {
        QByteArray returnType = noRef(def->normalizedType);
        fprintf(out, "    %s _t0{};\n", returnType.constData());
    }

    fprintf(out, "    QMetaObject::activate<%s>(%s, &staticMetaObject, %d, ",
            def->normalizedType.constData(), thisPtr.constData(), index);
    if (def->normalizedType == "void") {
        fprintf(out, "nullptr");
    } else {
        fprintf(out, "std::addressof(_t0)");
    }
    int i;
    for (i = 1; i < offset; ++i)
        fprintf(out, ", _t%d", i);
    fprintf(out, ");\n");

    if (def->normalizedType != "void")
        fprintf(out, "    return _t0;\n");
    fprintf(out, "}\n");
}